

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# happly.h
# Opt level: O1

void __thiscall happly::TypedProperty<short>::~TypedProperty(TypedProperty<short> *this)

{
  pointer psVar1;
  pointer pcVar2;
  
  (this->super_Property)._vptr_Property = (_func_int **)&PTR__TypedProperty_004b8030;
  psVar1 = (this->data).super__Vector_base<short,_std::allocator<short>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (psVar1 != (pointer)0x0) {
    operator_delete(psVar1);
  }
  (this->super_Property)._vptr_Property = (_func_int **)&PTR__Property_004b7b80;
  pcVar2 = (this->super_Property).name._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->super_Property).name.field_2) {
    operator_delete(pcVar2);
    return;
  }
  return;
}

Assistant:

virtual ~TypedProperty() override{}